

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.h
# Opt level: O1

void __thiscall
MathML::AST::ConstantExpression::arithmeticalBinaryOperation<long>
          (ConstantExpression *this,ConstantExpression *result,long *lhs,long *rhs,Operator op)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  String *__rhs;
  long lVar1;
  Error error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_58;
  undefined4 local_50;
  long *local_48 [2];
  long local_38 [2];
  
  switch(op) {
  case ADD:
    lVar1 = *rhs + *lhs;
    break;
  case SUB:
    lVar1 = *lhs - *rhs;
    break;
  case MUL:
    lVar1 = *rhs * *lhs;
    break;
  case DIV:
    lVar1 = *rhs;
    if ((lVar1 != 0) || (this->mErrorHandler == (ErrorHandler *)0x0)) {
      UNRECOVERED_JUMPTABLE = (result->super_INode)._vptr_INode[7];
      (*UNRECOVERED_JUMPTABLE)(result,*lhs / lVar1,*lhs % lVar1,UNRECOVERED_JUMPTABLE);
      return;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"division by zero","");
    local_58 = &PTR__Error_009e2c80;
    local_50 = 0;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_58);
    (*(result->super_INode)._vptr_INode[6])(0,result);
    if (local_48[0] == local_38) {
      return;
    }
    goto LAB_008463ef;
  default:
    if (this->mErrorHandler == (ErrorHandler *)0x0) {
      return;
    }
    __rhs = ArithmeticExpression::operatorString_abi_cxx11_(op);
    std::operator+(&local_78,"invalid operator: ",__rhs);
    local_58 = &PTR__Error_009e2c80;
    local_50 = 0;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_58);
    (*(result->super_INode)._vptr_INode[6])(0,result);
    if (local_48[0] == local_38) {
      return;
    }
LAB_008463ef:
    local_58 = &PTR__Error_009e2c80;
    operator_delete(local_48[0],local_38[0] + 1);
    return;
  }
  (*(result->super_INode)._vptr_INode[7])(result,lVar1);
  return;
}

Assistant:

void ConstantExpression::arithmeticalBinaryOperation( ConstantExpression& result, const T& lhs, const T& rhs, ArithmeticExpression::Operator op ) const
        {
            switch ( op )
            {

            case AST::ArithmeticExpression::ADD:
                result.setValue( lhs + rhs );
                return ;

            case AST::ArithmeticExpression::SUB:
                result.setValue( lhs - rhs );
                break;

            case AST::ArithmeticExpression::MUL:
                result.setValue( lhs * rhs );
                break;

            case AST::ArithmeticExpression::DIV:

                if ( rhs == 0 )
                {
                    if ( mErrorHandler )
                    {
                        Error error( Error::ERR_INVALIDPARAMS, "division by zero" );
                        mErrorHandler->handleError( &error );
                        result.setValue( 0. );
                        return;
                    }
                }

                result.setValue( lhs / rhs );
                break;

            default:
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, "invalid operator: " + ArithmeticExpression::operatorString( op ) );
                    mErrorHandler->handleError( &error );
                    result.setValue( 0. );
                    return;
                }
            }
        }